

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O3

void __thiscall Texture::Texture(Texture *this,Vector3f *c)

{
  bool bVar1;
  
  this->type = TEXTURE_COLOR;
  Vector3f::Vector3f(&this->color,c);
  *(undefined8 *)&(this->scale).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->scale).super__Function_base._M_functor + 8) = 0;
  (this->scale).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->scale)._M_invoker = (_Invoker_type)0x0;
  this->empty = false;
  bVar1 = operator==(c,&Vector3f::ZERO);
  if (bVar1) {
    this->empty = true;
  }
  return;
}

Assistant:

Texture(Vector3f c) :type(TEXTURE_COLOR), color(c) {
		if (c == Vector3f::ZERO) empty = true;
	}